

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O0

QIODevice * __thiscall QNetworkAccessBackend::createUploadByteDevice(QNetworkAccessBackend *this)

{
  bool bVar1;
  QNetworkAccessBackendPrivate *pQVar2;
  element_type *peVar3;
  QIODevice *pQVar4;
  long in_FS_OFFSET;
  offset_in_QNonContiguousByteDevice_to_subr unaff_retaddr;
  ConnectionType in_stack_00000020;
  QNetworkAccessBackendPrivate *d;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  shared_ptr<QNonContiguousByteDevice> *in_stack_ffffffffffffff80;
  QIODevice *local_50;
  Connection local_40;
  QIODevice local_38 [8];
  anon_class_8_1_8991fb9c_for_o *in_stack_ffffffffffffffd0;
  ContextType *in_stack_ffffffffffffffd8;
  Object *in_stack_ffffffffffffffe0;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QNetworkAccessBackend *)0x188e30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)&pQVar2->m_reply->outgoingDataBuffer);
  if (bVar1) {
    std::shared_ptr<QRingBuffer>::shared_ptr
              ((shared_ptr<QRingBuffer> *)in_stack_ffffffffffffff80,
               (shared_ptr<QRingBuffer> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QNonContiguousByteDeviceFactory::createShared(local_18,&stack0xffffffffffffffd8);
    std::shared_ptr<QNonContiguousByteDevice>::operator=
              (in_stack_ffffffffffffff80,
               (shared_ptr<QNonContiguousByteDevice> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::shared_ptr<QNonContiguousByteDevice>::~shared_ptr
              ((shared_ptr<QNonContiguousByteDevice> *)0x188e9f);
    std::shared_ptr<QRingBuffer>::~shared_ptr((shared_ptr<QRingBuffer> *)0x188ea9);
  }
  else {
    if (pQVar2->m_reply->outgoingData == (QIODevice *)0x0) {
      local_50 = (QIODevice *)0x0;
      goto LAB_00188fb6;
    }
    QNonContiguousByteDeviceFactory::createShared(local_38);
    std::shared_ptr<QNonContiguousByteDevice>::operator=
              (in_stack_ffffffffffffff80,
               (shared_ptr<QNonContiguousByteDevice> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::shared_ptr<QNonContiguousByteDevice>::~shared_ptr
              ((shared_ptr<QNonContiguousByteDevice> *)0x188efe);
  }
  bVar1 = isSynchronous((QNetworkAccessBackend *)0x188f1a);
  if (!bVar1) {
    std::__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>::get
              (&(pQVar2->uploadByteDevice).
                super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>);
    QObject::
    connect<void(QNonContiguousByteDevice::*)(long_long,long_long),QNetworkAccessBackend::createUploadByteDevice()::__0>
              (in_stack_ffffffffffffffe0,unaff_retaddr,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0,in_stack_00000020);
    QMetaObject::Connection::~Connection(&local_40);
  }
  peVar3 = std::__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(pQVar2->uploadByteDevice).
                       super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>);
  pQVar4 = (QIODevice *)QNonContiguousByteDeviceFactory::wrap(peVar3);
  pQVar2->wrappedUploadByteDevice = pQVar4;
  local_50 = pQVar2->wrappedUploadByteDevice;
LAB_00188fb6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

QIODevice *QNetworkAccessBackend::createUploadByteDevice()
{
    Q_D(QNetworkAccessBackend);

    if (d->m_reply->outgoingDataBuffer)
        d->uploadByteDevice =
                QNonContiguousByteDeviceFactory::createShared(d->m_reply->outgoingDataBuffer);
    else if (d->m_reply->outgoingData) {
        d->uploadByteDevice =
                QNonContiguousByteDeviceFactory::createShared(d->m_reply->outgoingData);
    } else {
        return nullptr;
    }

    // We want signal emissions only for normal asynchronous uploads
    if (!isSynchronous()) {
        connect(d->uploadByteDevice.get(), &QNonContiguousByteDevice::readProgress, this,
                [this](qint64 a, qint64 b) {
                    Q_D(QNetworkAccessBackend);
                    if (!d->m_reply->isFinished)
                        d->m_reply->emitUploadProgress(a, b);
                });
    }

    d->wrappedUploadByteDevice = QNonContiguousByteDeviceFactory::wrap(d->uploadByteDevice.get());
    return d->wrappedUploadByteDevice;
}